

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

string * __thiscall websocketpp::uri::str_abi_cxx11_(uri *this)

{
  ostream *poVar1;
  short sVar2;
  string *in_RSI;
  string *in_RDI;
  stringstream s;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,in_RSI);
  poVar1 = std::operator<<(poVar1,"://");
  std::operator<<(poVar1,in_RSI + 0x20);
  sVar2 = 0x50;
  if (((byte)in_RSI[0x62] & 1) != 0) {
    sVar2 = 0x1bb;
  }
  if (*(short *)(in_RSI + 0x60) != sVar2) {
    poVar1 = std::operator<<(local_188,":");
    std::ostream::operator<<(poVar1,*(ushort *)(in_RSI + 0x60));
  }
  std::operator<<(local_188,in_RSI + 0x40);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string str() const {
        std::stringstream s;

        s << m_scheme << "://" << m_host;

        if (m_port != (m_secure ? uri_default_secure_port : uri_default_port)) {
            s << ":" << m_port;
        }

        s << m_resource;
        return s.str();
    }